

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_table_scan.cpp
# Opt level: O2

bool __thiscall duckdb::PhysicalTableScan::Equals(PhysicalTableScan *this,PhysicalOperator *other_p)

{
  bool bVar1;
  PhysicalTableScan *pPVar2;
  
  if ((this->super_PhysicalOperator).type == other_p->type) {
    pPVar2 = PhysicalOperator::Cast<duckdb::PhysicalTableScan>(other_p);
    if ((this->function).function == (pPVar2->function).function) {
      bVar1 = ::std::operator!=(&(this->column_ids).
                                 super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
                                ,&(pPVar2->column_ids).
                                  super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
                               );
      if (!bVar1) {
        bVar1 = FunctionData::Equals
                          ((this->bind_data).
                           super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>
                           ._M_t.
                           super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
                           .super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl,
                           (pPVar2->bind_data).
                           super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>
                           ._M_t.
                           super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
                           .super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl);
        return bVar1;
      }
    }
  }
  return false;
}

Assistant:

bool PhysicalTableScan::Equals(const PhysicalOperator &other_p) const {
	if (type != other_p.type) {
		return false;
	}
	auto &other = other_p.Cast<PhysicalTableScan>();
	if (function.function != other.function.function) {
		return false;
	}
	if (column_ids != other.column_ids) {
		return false;
	}
	if (!FunctionData::Equals(bind_data.get(), other.bind_data.get())) {
		return false;
	}
	return true;
}